

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O3

void __thiscall VehicleState::Propagator::OE2State(Propagator *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> order;
  Matrix3d R;
  allocator_type local_d1;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  Matrix3d local_50;
  
  local_b8 = this->mu_;
  local_c0 = this->e_;
  local_d0 = (this->nu_ * 180.0) / 3.141592653589793;
  local_c8 = (1.0 - local_c0 * local_c0) * this->a_;
  local_b0 = (this->periap_ * 3.141592653589793) / 180.0;
  local_78 = this->i_;
  dStack_70 = this->ascend_;
  dVar2 = cos(local_d0);
  local_c8 = (local_c8 / (dVar2 * local_c0 + 1.0)) * local_b8;
  dVar2 = cos(local_d0);
  dVar2 = (dVar2 * local_c0 + 1.0) * local_c8;
  if (dVar2 < 0.0) {
    sqrt(dVar2);
  }
  cos(local_d0);
  sin(local_d0);
  cos(local_d0);
  sin(local_d0);
  cos(local_d0);
  local_50.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       2.12199579244747e-314;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1].
  _0_4_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l,&local_d1);
  auVar3._0_8_ = dStack_70 * 3.141592653589793;
  auVar3._8_8_ = local_78 * 3.141592653589793;
  auVar1._8_8_ = 0x4066800000000000;
  auVar1._0_8_ = 0x4066800000000000;
  local_68 = divpd(auVar3,auVar1);
  local_58 = local_b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,&local_90);
  Util::Angle2RotM(&local_50,(Vector3d *)local_68,&local_a8);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Propagator::OE2State(){

		//extract locals
		double mu = this->mu_; // gravity constant
		double a = this->a_; //semi-major axis
		double e = this->e_; //eccentricity
		double i = this->i_; //inclination
		double Ohm = this->ascend_; //longitude of ascending node
		double w = this->periap_; //argument of periapsis
		double nu = this->nu_; //true anomaly

		//convert true anomaly to radian
		double nu_rad = nu*180.0/M_PI;

		//calculate the norm of position
		double nr = a*(1.0 - pow(e,2)) / (1 + e*cos(nu_rad));

		//angular velocity
		double h = sqrt(mu*nr*(1+e*cos(nu_rad)));

		// radius in perifocal reference frame
		Eigen::Vector3d r_pqw(cos(nu_rad), sin(nu_rad), 0.0);
		r_pqw = pow(h,2)/(mu*(1+e*cos(nu_rad)))*r_pqw;

		// velocity in perifocal reference frame
		Eigen::Vector3d v_pqw(-sin(nu_rad), e+cos(nu_rad), 0);
		v_pqw = v_pqw*(mu/h);

		// generate 313 rotation matric from perifocal to geocentric vector rotation
		Eigen::Vector3d angles(M_PI*Ohm/180, M_PI*i/180, M_PI*w/180);
		std::vector<int> order{3,1,3};
		Eigen::Matrix3d R = Util::Angle2RotM(angles, order);

		// rotate vectors
		Eigen::Vector3d pos = R*r_pqw;
		Eigen::Vector3d vel = R*v_pqw;

		//Display
		// std::cout << "position: \n" << pos << std::endl;
		// std::cout << "velocity: \n" << vel << std::endl;

		//Assign

	}